

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_sort.c
# Opt level: O3

REF_STATUS ref_sort_heap_glob(REF_INT n,REF_GLOB *original,REF_INT *sorted_index)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  REF_GLOB RVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  auVar1 = _DAT_00211350;
  if (0 < n) {
    lVar4 = (ulong)(uint)n - 1;
    auVar11._8_4_ = (int)lVar4;
    auVar11._0_8_ = lVar4;
    auVar11._12_4_ = (int)((ulong)lVar4 >> 0x20);
    uVar5 = 0;
    auVar11 = auVar11 ^ _DAT_00211350;
    auVar12 = _DAT_00211340;
    do {
      auVar13 = auVar12 ^ auVar1;
      if ((bool)(~(auVar13._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar13._0_4_ ||
                  auVar11._4_4_ < auVar13._4_4_) & 1)) {
        sorted_index[uVar5] = (int)uVar5;
      }
      if ((auVar13._12_4_ != auVar11._12_4_ || auVar13._8_4_ <= auVar11._8_4_) &&
          auVar13._12_4_ <= auVar11._12_4_) {
        sorted_index[uVar5 + 1] = (int)uVar5 + 1;
      }
      uVar5 = uVar5 + 2;
      lVar4 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 2;
      auVar12._8_8_ = lVar4 + 2;
    } while ((n + 1U & 0xfffffffe) != uVar5);
    if (n != 1) {
      uVar6 = n - 1;
      uVar5 = (ulong)(((uint)n >> 1) + 1);
      do {
        if ((int)uVar5 < 2) {
          iVar3 = sorted_index[uVar6];
          RVar7 = original[iVar3];
          sorted_index[uVar6] = *sorted_index;
          uVar2 = 1;
          uVar6 = uVar6 - 1;
          if (uVar6 == 0) {
            *sorted_index = iVar3;
            return 0;
          }
        }
        else {
          uVar2 = (ulong)((int)uVar5 - 1);
          iVar3 = sorted_index[uVar5 - 2];
          RVar7 = original[iVar3];
        }
        iVar8 = (int)uVar2 + -1;
        iVar9 = (int)uVar2 * 2 + -1;
        if (iVar9 <= (int)uVar6) {
          do {
            iVar10 = iVar9;
            if ((iVar9 < (int)uVar6) &&
               (original[sorted_index[iVar9]] < original[sorted_index[(long)iVar9 + 1]])) {
              iVar10 = iVar9 + 1;
            }
            if (original[sorted_index[iVar10]] <= RVar7) break;
            sorted_index[iVar8] = sorted_index[iVar10];
            iVar9 = iVar10 * 2 + 1;
            iVar8 = iVar10;
          } while (iVar10 * 2 < (int)uVar6);
        }
        sorted_index[iVar8] = iVar3;
        uVar5 = uVar2;
      } while( true );
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_sort_heap_glob(REF_INT n, REF_GLOB *original,
                                      REF_INT *sorted_index) {
  REF_GLOB q;
  REF_INT i, j, l, ir, indxt;

  for (i = 0; i < n; i++) sorted_index[i] = i;

  if (n < 2) return REF_SUCCESS;

  l = (n >> 1) + 1;
  ir = n - 1;
  for (;;) {
    if (l > 1) {
      l--;
      indxt = sorted_index[l - 1];
      q = original[indxt];
    } else {
      indxt = sorted_index[ir];
      q = original[indxt];
      sorted_index[ir] = sorted_index[0];
      if (--ir == 0) {
        sorted_index[0] = indxt;
        break;
      }
    }
    i = l - 1;
    j = l + i;

    while (j <= ir) {
      if (j < ir) {
        if (original[sorted_index[j]] < original[sorted_index[j + 1]]) j++;
      }
      if (q < original[sorted_index[j]]) {
        sorted_index[i] = sorted_index[j];
        i = j;

        j++;
        j <<= 1;
        j--;

      } else
        break;
    }
    sorted_index[i] = indxt;
  }

  return REF_SUCCESS;
}